

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

bool __thiscall binlog::SessionWriter::replaceChannel(SessionWriter *this,size_t minQueueCapacity)

{
  unsigned_long *puVar1;
  element_type *peVar2;
  long in_RSI;
  long in_RDI;
  WriterProp wp;
  size_t newCapacity;
  WriterProp *in_stack_fffffffffffffee8;
  WriterProp *in_stack_fffffffffffffef0;
  QueueWriter *this_00;
  WriterProp *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  Session *in_stack_ffffffffffffff48;
  QueueWriter local_80;
  uint64_t local_60;
  string local_58 [32];
  undefined8 local_38;
  unsigned_long local_30;
  size_t local_28;
  unsigned_long local_20;
  long local_18;
  
  local_18 = in_RSI;
  local_28 = detail::QueueWriter::capacity((QueueWriter *)(in_RDI + 0x18));
  local_30 = local_18 * 2;
  puVar1 = std::max<unsigned_long>(&local_28,&local_30);
  local_20 = *puVar1;
  peVar2 = std::
           __shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x10e947);
  local_60 = (peVar2->writerProp).id;
  peVar2 = std::
           __shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x10e969);
  std::__cxx11::string::string(local_58,(string *)&(peVar2->writerProp).name);
  local_38 = 0;
  WriterProp::WriterProp(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Session::createChannel
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_00 = &local_80;
  std::shared_ptr<binlog::Session::Channel>::operator=
            ((shared_ptr<binlog::Session::Channel> *)this_00,
             (shared_ptr<binlog::Session::Channel> *)in_stack_fffffffffffffee8);
  std::shared_ptr<binlog::Session::Channel>::~shared_ptr
            ((shared_ptr<binlog::Session::Channel> *)0x10ea01);
  WriterProp::~WriterProp((WriterProp *)0x10ea0b);
  std::__shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x10ea15);
  Session::Channel::queue((Channel *)0x10ea1d);
  detail::QueueWriter::QueueWriter(this_00,(Queue *)in_stack_fffffffffffffee8);
  *(WriterProp **)(in_RDI + 0x18) = in_stack_ffffffffffffff38;
  *(size_t *)(in_RDI + 0x20) = in_stack_ffffffffffffff40;
  *(Session **)(in_RDI + 0x28) = in_stack_ffffffffffffff48;
  WriterProp::~WriterProp((WriterProp *)0x10ea59);
  return true;
}

Assistant:

inline bool SessionWriter::replaceChannel(std::size_t minQueueCapacity) noexcept
{
  const std::size_t newCapacity = (std::max)(_qw.capacity(), 2 * minQueueCapacity);

  try
  {
    WriterProp wp{_channel->writerProp.id, _channel->writerProp.name, 0}; // avoid racing on the last field
    _channel = _session->createChannel(newCapacity, std::move(wp));
    _qw = detail::QueueWriter(_channel->queue());
  }
  catch (...)
  {
    // allocation and mutex lock in createChannel can throw,
    // but addEvent is more efficient if noexcept:
    // indicate failure by return value instead.
    return false;
  }

  return true;
}